

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CustomMessageOperator::process
          (CustomMessageOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  undefined8 *in_RDX;
  Message *local_10;
  
  local_10 = (Message *)*in_RDX;
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) {
    (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)local_10;
    *in_RDX = 0;
  }
  else {
    *in_RDX = 0;
    if (message[3]._M_t.
        super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
        super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)message[4]._M_t.
              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
              super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)
              (this,message + 1,&local_10);
    if (local_10 != (Message *)0x0) {
      CLI::std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_10,local_10);
    }
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> CustomMessageOperator::process(std::unique_ptr<Message> message)
{
    if (messageFunction) {
        return messageFunction(std::move(message));
    }
    return message;
}